

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dry-comparisons.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> * __thiscall
rollbear::internal::logical_tuple<int,int,int>::print<char,std::char_traits<char>>
          (logical_tuple<int,int,int> *this,char *label,
          basic_ostream<char,_std::char_traits<char>_> *os)

{
  ostream *poVar1;
  tuple *__t;
  anon_class_8_1_3fcf66a2 local_28;
  basic_ostream<char,_std::char_traits<char>_> *local_20;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  char *label_local;
  logical_tuple<int,_int,_int> *this_local;
  
  local_20 = os;
  os_local = (basic_ostream<char,_std::char_traits<char>_> *)label;
  label_local = (char *)this;
  poVar1 = std::operator<<(os,label);
  std::operator<<(poVar1,'{');
  local_28.os = local_20;
  __t = logical_tuple<int,_int,_int>::self((logical_tuple<int,_int,_int> *)this);
  std::
  apply<rollbear::internal::logical_tuple<int,int,int>::print<char,std::char_traits<char>>(char_const*,std::ostream&)const::_lambda((auto:1_const&)___)_1_,std::tuple<int,int,int>const&>
            (&local_28,__t);
  poVar1 = std::operator<<(local_20,'}');
  return poVar1;
}

Assistant:

std::basic_ostream<Char, Traits>& print(const Char* label, std::basic_ostream<Char, Traits>& os) const
    {
        os << label << '{';
        std::apply([&os](const auto& ... v) {
            int first = 1;
            ((os << &","[std::exchange(first, 0)] << v),...);
        }, self());
        return os << '}';
    }